

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void response_data_free(CManager cm,void *resp_void)

{
  void *__ptr;
  undefined4 *in_RSI;
  int j;
  FMStructDescList list;
  int i;
  response_spec *resp;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  int local_1c;
  
  switch(*in_RSI) {
  case 0:
  case 2:
    free_struct_list((FMStructDescList)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                    );
    free(*(void **)(in_RSI + 4));
    break;
  case 1:
    free_struct_list((FMStructDescList)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                    );
    free_struct_list((FMStructDescList)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                    );
    free(*(void **)(in_RSI + 6));
    break;
  case 3:
    local_1c = 0;
    while (*(long *)(*(long *)(in_RSI + 2) + (long)local_1c * 8) != 0) {
      __ptr = *(void **)(*(long *)(in_RSI + 2) + (long)local_1c * 8);
      iVar1 = 0;
      while (*(long *)((long)__ptr + (long)iVar1 * 0x20) != 0) {
        free(*(void **)((long)__ptr + (long)iVar1 * 0x20));
        free_FMfield_list(*(undefined8 *)((long)__ptr + (long)iVar1 * 0x20 + 8));
        iVar1 = iVar1 + 1;
      }
      free(__ptr);
      local_1c = local_1c + 1;
    }
    free(*(void **)(in_RSI + 2));
    free(*(void **)(in_RSI + 10));
    free(*(void **)(in_RSI + 4));
  }
  free(in_RSI);
  return;
}

Assistant:

void
response_data_free(CManager cm, void *resp_void)
{
    struct response_spec *resp = (struct response_spec*)resp_void;
    switch(resp->response_type) {
    case Response_Filter:
    case Response_Router:
	free_struct_list(resp->u.filter.format_list);
        free(resp->u.filter.function);
	break;
    case Response_Transform:
	free_struct_list(resp->u.transform.in_format_list);
	free_struct_list(resp->u.transform.out_format_list);
        free(resp->u.transform.function);
	break;
    case Response_Multityped:
      {
	  int i = 0;
	  while(resp->u.multityped.struct_list[i] != NULL) {
	      FMStructDescList list = resp->u.multityped.struct_list[i];
	      int j = 0;
	      while (list[j].format_name != NULL) {
		  free((void*)list[j].format_name);
		  free_FMfield_list(list[j].field_list);
		  j++;
	      }
	      free(list);
	      i++;
	  }
      }
      free(resp->u.multityped.struct_list);
      free(resp->u.multityped.reference_input_format_list);
      free(resp->u.multityped.function);
      break;
    default:
	break;
    }
    free(resp);
}